

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O0

void intgemm::SSSE3::Kernels8::QuantizeU(float *input,uint8_t *output,float quant_mult,Index size)

{
  FRegister mult_reg;
  long lVar1;
  uint in_EDX;
  undefined4 *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar2;
  float *end;
  FRegister q;
  float *in_stack_ffffffffffffffc8;
  undefined8 uVar3;
  undefined4 *local_10;
  long local_8;
  
  afVar2 = set1_ps<float__vector(4)>(in_XMM0_Da);
  uVar3 = afVar2._0_8_;
  lVar1 = in_RDI + (ulong)in_EDX * 4;
  local_10 = in_RSI;
  for (local_8 = in_RDI; local_8 != lVar1; local_8 = local_8 + 0x40) {
    mult_reg[2] = (float)(int)uVar3;
    mult_reg[3] = (float)(int)((ulong)uVar3 >> 0x20);
    mult_reg[0] = (float)(int)lVar1;
    mult_reg[1] = (float)(int)((ulong)lVar1 >> 0x20);
    QuantizeTile8::ConsecutiveU(mult_reg,in_stack_ffffffffffffffc8);
    *local_10 = extraout_XMM0_Da;
    local_10[1] = extraout_XMM0_Db;
    local_10[2] = extraout_XMM0_Dc;
    local_10[3] = extraout_XMM0_Dd;
    local_10 = local_10 + 4;
  }
  return;
}

Assistant:

INTGEMM_SSSE3 static void QuantizeU(const float *input, uint8_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(output) % 16 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      *reinterpret_cast<__m128i*>(output) = QuantizeTile8::ConsecutiveU(q, input);
    }
  }